

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O1

any * shadow::pointer_detail::generic_dereference_bind_point<b>
                (any *__return_storage_ptr__,any *value)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  holder_base *phVar3;
  
  phVar3 = (holder_base *)((long)&value->field_1 + 8);
  if (value->on_heap_ != false) {
    phVar3 = (value->field_1).heap + 1;
  }
  pp_Var1 = phVar3->_vptr_holder_base;
  __return_storage_ptr__->on_heap_ = true;
  phVar3 = (holder_base *)operator_new(0x20);
  phVar3->_vptr_holder_base = (_func_int **)&PTR_copy_0012ed78;
  pp_Var2 = (_func_int **)pp_Var1[1];
  phVar3[1]._vptr_holder_base = (_func_int **)*pp_Var1;
  phVar3[2]._vptr_holder_base = pp_Var2;
  phVar3[3]._vptr_holder_base = (_func_int **)pp_Var1[2];
  (__return_storage_ptr__->field_1).heap = phVar3;
  return __return_storage_ptr__;
}

Assistant:

inline any
generic_dereference_bind_point(any& value)
{
    return any(*(value.get<T*>()));
}